

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefSite.h
# Opt level: O0

DefSiteSet * __thiscall dg::dda::DefSiteSet::intersect(DefSiteSet *this,DefSiteSet *rhs)

{
  bool bVar1;
  Interval *pIVar2;
  undefined8 in_RDX;
  GenericDefSite<dg::dda::RWNode> *in_RSI;
  DefSiteSet *in_RDI;
  Interval *I;
  iterator __end4;
  iterator __begin4;
  IntervalsList *__range4;
  iterator rit;
  pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList> *lit;
  iterator __end2_2;
  iterator __begin2_2;
  map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  *__range2_2;
  GenericDefSite<dg::dda::RWNode> *ds_1;
  iterator __end2_1;
  iterator __begin2_1;
  DefSiteSet *__range2_1;
  GenericDefSite<dg::dda::RWNode> *ds;
  iterator __end2;
  iterator __begin2;
  DefSiteSet *__range2;
  map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  rhssites;
  map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  lhssites;
  DefSiteSet *retval;
  reference in_stack_fffffffffffffe58;
  reference in_stack_fffffffffffffe60;
  pair<dg::Offset,_dg::Offset> *in_stack_fffffffffffffe68;
  Interval *in_stack_fffffffffffffe70;
  mapped_type *in_stack_fffffffffffffe78;
  DefSiteSet *__args;
  key_type *in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea1;
  Interval *in_stack_fffffffffffffea8;
  reference in_stack_fffffffffffffeb0;
  iterator in_stack_fffffffffffffeb8;
  _Self local_140;
  IntervalsList *local_138;
  _Self local_130;
  _Self local_128;
  reference local_120;
  _Self local_118;
  _Self local_110;
  undefined1 *local_108;
  undefined1 local_f9;
  pair<dg::Offset,_dg::Offset> local_f8;
  reference local_d8;
  _Self local_d0;
  _Self local_c8;
  undefined8 local_c0;
  pair<dg::Offset,_dg::Offset> local_b8;
  reference local_98;
  _Self local_90;
  _Self local_88 [8];
  undefined1 local_48 [48];
  undefined8 local_18;
  
  __args = in_RDI;
  local_18 = in_RDX;
  std::
  map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  ::map((map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
         *)0x17c8e6);
  std::
  map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  ::map((map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
         *)0x17c8f3);
  local_88[0]._M_node =
       (_Base_ptr)
       std::
       set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
       ::begin((set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                *)in_stack_fffffffffffffe58);
  local_90._M_node =
       (_Base_ptr)
       std::
       set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
       ::end((set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
              *)in_stack_fffffffffffffe58);
  while (bVar1 = std::operator!=(local_88,&local_90), bVar1) {
    local_98 = std::_Rb_tree_const_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_>::operator*
                         ((_Rb_tree_const_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_> *)
                          0x17c955);
    in_stack_fffffffffffffe78 =
         std::
         map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
         ::operator[]((map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
                       *)CONCAT71(in_stack_fffffffffffffea1,in_stack_fffffffffffffea0),
                      in_stack_fffffffffffffe98);
    local_b8 = GenericDefSite<dg::dda::RWNode>::getInterval(in_RSI);
    IntervalsList::Interval::Interval(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    IntervalsList::add((IntervalsList *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::_Rb_tree_const_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_>::operator++
              ((_Rb_tree_const_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_> *)
               in_stack_fffffffffffffe60);
  }
  local_c0 = local_18;
  local_c8._M_node =
       (_Base_ptr)
       std::
       set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
       ::begin((set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                *)in_stack_fffffffffffffe58);
  local_d0._M_node =
       (_Base_ptr)
       std::
       set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
       ::end((set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
              *)in_stack_fffffffffffffe58);
  while (bVar1 = std::operator!=(&local_c8,&local_d0), bVar1) {
    local_d8 = std::_Rb_tree_const_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_>::operator*
                         ((_Rb_tree_const_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_> *)
                          0x17ca32);
    pIVar2 = (Interval *)
             std::
             map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
             ::operator[]((map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
                           *)CONCAT71(in_stack_fffffffffffffea1,in_stack_fffffffffffffea0),
                          in_stack_fffffffffffffe98);
    local_f8 = GenericDefSite<dg::dda::RWNode>::getInterval(in_RSI);
    IntervalsList::Interval::Interval(pIVar2,in_stack_fffffffffffffe68);
    IntervalsList::add((IntervalsList *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::_Rb_tree_const_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_>::operator++
              ((_Rb_tree_const_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_> *)
               in_stack_fffffffffffffe60);
  }
  local_f9 = 0;
  DefSiteSet((DefSiteSet *)0x17cabc);
  local_108 = local_48;
  local_110._M_node =
       (_Base_ptr)
       std::
       map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
       ::begin((map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
                *)in_stack_fffffffffffffe58);
  local_118._M_node =
       (_Base_ptr)
       std::
       map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
       ::end((map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
              *)in_stack_fffffffffffffe58);
  while (bVar1 = std::operator!=(&local_110,&local_118), bVar1) {
    local_120 = std::_Rb_tree_iterator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>::
                operator*((_Rb_tree_iterator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>
                           *)0x17cb21);
    local_128._M_node =
         (_Base_ptr)
         std::
         map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
         ::find((map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
                 *)in_stack_fffffffffffffe58,(key_type *)0x17cb3e);
    local_130._M_node =
         (_Base_ptr)
         std::
         map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
         ::end((map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
                *)in_stack_fffffffffffffe58);
    bVar1 = std::operator!=(&local_128,&local_130);
    if (bVar1) {
      pIVar2 = (Interval *)&local_120->second;
      std::_Rb_tree_iterator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>::operator->
                ((_Rb_tree_iterator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_> *)
                 0x17cb91);
      local_138 = IntervalsList::intersectWith
                            ((IntervalsList *)in_stack_fffffffffffffeb8._M_node,
                             (IntervalsList *)in_stack_fffffffffffffeb0);
      local_140._M_node =
           (_List_node_base *)IntervalsList::begin((IntervalsList *)in_stack_fffffffffffffe58);
      in_stack_fffffffffffffeb8 = IntervalsList::end((IntervalsList *)in_stack_fffffffffffffe58);
      while (bVar1 = std::operator!=(&local_140,(_Self *)&stack0xfffffffffffffeb8), bVar1) {
        in_stack_fffffffffffffe60 =
             std::_List_iterator<dg::dda::IntervalsList::Interval>::operator*
                       ((_List_iterator<dg::dda::IntervalsList::Interval> *)0x17cbe4);
        in_stack_fffffffffffffe58 = local_120;
        in_stack_fffffffffffffeb0 = in_stack_fffffffffffffe60;
        IntervalsList::Interval::length(pIVar2);
        std::
        set<dg::dda::GenericDefSite<dg::dda::RWNode>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
        ::emplace<dg::dda::RWNode*const&,dg::Offset_const&,dg::Offset>
                  ((set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                    *)in_RSI,(RWNode **)__args,(Offset *)in_RDI,(Offset *)in_stack_fffffffffffffe78)
        ;
        std::_List_iterator<dg::dda::IntervalsList::Interval>::operator++(&local_140);
      }
    }
    std::_Rb_tree_iterator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>::operator++
              ((_Rb_tree_iterator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_> *)
               in_stack_fffffffffffffe60);
  }
  local_f9 = 1;
  std::
  map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  ::~map((map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
          *)0x17cc7a);
  std::
  map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  ::~map((map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
          *)0x17cc87);
  return __args;
}

Assistant:

DefSiteSet intersect(const DefSiteSet &rhs) const {
        std::map<DefSite::NodeTy *, IntervalsList> lhssites;
        std::map<DefSite::NodeTy *, IntervalsList> rhssites;

        for (const auto &ds : *this) {
            lhssites[ds.target].add(ds.getInterval());
        }
        for (const auto &ds : rhs) {
            rhssites[ds.target].add(ds.getInterval());
        }

        DefSiteSet retval;

        for (auto &lit : lhssites) {
            auto rit = rhssites.find(lit.first);
            if (rit != rhssites.end()) {
                for (const auto &I : lit.second.intersectWith(rit->second)) {
                    retval.emplace(lit.first, I.start, I.length());
                }
            }
        }

        return retval;
    }